

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result wabt::anon_unknown_1::CheckTypes
                 (Location *loc,TypeVector *actual,TypeVector *expected,char *desc,char *index_kind,
                 Errors *errors)

{
  ulong uVar1;
  size_t this;
  Errors *pEVar2;
  TypeVector *pTVar3;
  size_type sVar4;
  size_type sVar5;
  const_reference pvVar6;
  Result local_7c;
  string local_78;
  ErrorLevel local_58;
  Enum local_54;
  Type local_50;
  Enum local_4c;
  ulong local_48;
  size_t i;
  Errors *errors_local;
  char *index_kind_local;
  char *desc_local;
  TypeVector *expected_local;
  TypeVector *actual_local;
  Location *loc_local;
  Result result;
  
  i = (size_t)errors;
  errors_local = (Errors *)index_kind;
  index_kind_local = desc;
  desc_local = (char *)expected;
  expected_local = actual;
  actual_local = (TypeVector *)loc;
  Result::Result((Result *)((long)&loc_local + 4),Ok);
  sVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(expected_local);
  sVar5 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                    ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)desc_local);
  pTVar3 = actual_local;
  this = i;
  if (sVar4 == sVar5) {
    for (local_48 = 0; uVar1 = local_48,
        sVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(expected_local),
        pTVar3 = actual_local, uVar1 < sVar4; local_48 = local_48 + 1) {
      pvVar6 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         (expected_local,local_48);
      local_50.enum_ = pvVar6->enum_;
      pvVar6 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)desc_local,local_48);
      local_54 = pvVar6->enum_;
      local_4c = (Enum)CheckTypeIndex((Location *)pTVar3,local_50,(Type)local_54,index_kind_local,
                                      (Index)local_48,(char *)errors_local,(Errors *)i);
      Result::operator|=((Result *)((long)&loc_local + 4),(Result)local_4c);
    }
  }
  else {
    local_58 = Error;
    sVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)desc_local);
    pEVar2 = errors_local;
    sVar5 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(expected_local);
    StringPrintf_abi_cxx11_(&local_78,"expected %zd %ss, got %zd",sVar4,pEVar2,sVar5);
    std::vector<wabt::Error,std::allocator<wabt::Error>>::
    emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
              ((vector<wabt::Error,std::allocator<wabt::Error>> *)this,&local_58,(Location *)pTVar3,
               &local_78);
    std::__cxx11::string::~string((string *)&local_78);
    Result::Result(&local_7c,Error);
    loc_local._4_4_ = local_7c.enum_;
  }
  return (Result)loc_local._4_4_;
}

Assistant:

Result CheckTypes(const Location& loc,
                  const TypeVector& actual,
                  const TypeVector& expected,
                  const char* desc,
                  const char* index_kind,
                  Errors* errors) {
  Result result = Result::Ok;
  if (actual.size() == expected.size()) {
    for (size_t i = 0; i < actual.size(); ++i) {
      result |= CheckTypeIndex(loc, actual[i], expected[i], desc, i, index_kind,
                               errors);
    }
  } else {
    errors->emplace_back(
        ErrorLevel::Error, loc,
        StringPrintf("expected %" PRIzd " %ss, got %" PRIzd, expected.size(),
                     index_kind, actual.size()));
    result = Result::Error;
  }
  return result;
}